

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O2

char * escape_string(char *src)

{
  long lVar1;
  char *pcVar2;
  long lVar3;
  char cVar4;
  
  lVar3 = 1;
  lVar1 = 0;
  do {
    cVar4 = src[lVar3 + -1];
    if ((cVar4 == '\"') || (cVar4 == '\\')) {
      lVar1 = lVar1 + 1;
    }
    else if (cVar4 == '\0') {
      pcVar2 = (char *)(*Curl_cmalloc)(lVar3 + lVar1);
      if (pcVar2 == (char *)0x0) {
        return (char *)0x0;
      }
      lVar3 = 0;
      do {
        cVar4 = *src;
        if ((cVar4 == '\"') || (cVar4 == '\\')) {
          pcVar2[lVar3] = '\\';
          lVar3 = lVar3 + 1;
          cVar4 = *src;
        }
        else if (cVar4 == '\0') {
          pcVar2[lVar3] = '\0';
          return pcVar2;
        }
        pcVar2[lVar3] = cVar4;
        lVar3 = lVar3 + 1;
        src = src + 1;
      } while( true );
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

static char *escape_string(const char *src)
{
  size_t bytecount = 0;
  size_t i;
  char *dst;

  for(i = 0; src[i]; i++)
    if(src[i] == '"' || src[i] == '\\')
      bytecount++;

  bytecount += i;
  dst = malloc(bytecount + 1);
  if(!dst)
    return NULL;

  for(i = 0; *src; src++) {
    if(*src == '"' || *src == '\\')
      dst[i++] = '\\';
    dst[i++] = *src;
  }

  dst[i] = '\0';
  return dst;
}